

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

void free_filters(rar5 *rar)

{
  filter_info *d_00;
  wchar_t wVar1;
  size_t sVar2;
  void **value;
  filter_info *local_20;
  filter_info *f;
  cdeque *d;
  rar5 *rar_local;
  
  f = (filter_info *)&(rar->cstate).filters;
  d = (cdeque *)rar;
  while (sVar2 = cdeque_size((cdeque *)f), d_00 = f, sVar2 != 0) {
    local_20 = (filter_info *)0x0;
    value = cdeque_filter_p(&local_20);
    wVar1 = cdeque_pop_front((cdeque *)d_00,value);
    if (wVar1 == L'\0') {
      free(local_20);
    }
  }
  cdeque_clear((cdeque *)f);
  d[0x4b4].arr = (size_t *)0x0;
  d[0x4b5].beg_pos = 0;
  d[0x4b5].end_pos = 0;
  d[0x4b5].cap_mask = 0;
  d[0x4b5].size = 0;
  return;
}

Assistant:

static void free_filters(struct rar5* rar) {
	struct cdeque* d = &rar->cstate.filters;

	/* Free any remaining filters. All filters should be naturally
	 * consumed by the unpacking function, so remaining filters after
	 * unpacking normally mean that unpacking wasn't successful.
	 * But still of course we shouldn't leak memory in such case. */

	/* cdeque_size() is a fast operation, so we can use it as a loop
	 * expression. */
	while(cdeque_size(d) > 0) {
		struct filter_info* f = NULL;

		/* Pop_front will also decrease the collection's size. */
		if (CDE_OK == cdeque_pop_front(d, cdeque_filter_p(&f)))
			free(f);
	}

	cdeque_clear(d);

	/* Also clear out the variables needed for sanity checking. */
	rar->cstate.last_block_start = 0;
	rar->cstate.last_block_length = 0;
}